

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::LiteralExpressionSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if (((((kind == DefaultPatternKeyExpression) || (kind == IntegerLiteralExpression)) ||
       (kind == NullLiteralExpression)) ||
      ((kind == RealLiteralExpression || (kind == StringLiteralExpression)))) ||
     ((kind == TimeLiteralExpression ||
      ((kind == UnbasedUnsizedLiteralExpression || (kind == WildcardLiteralExpression)))))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool LiteralExpressionSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::DefaultPatternKeyExpression:
        case SyntaxKind::IntegerLiteralExpression:
        case SyntaxKind::NullLiteralExpression:
        case SyntaxKind::RealLiteralExpression:
        case SyntaxKind::StringLiteralExpression:
        case SyntaxKind::TimeLiteralExpression:
        case SyntaxKind::UnbasedUnsizedLiteralExpression:
        case SyntaxKind::WildcardLiteralExpression:
            return true;
        default:
            return false;
    }
}